

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

void print_object_type(CrispyValue value)

{
  ObjectType OVar1;
  Object *object;
  CrispyValue value_local;
  
  OVar1 = (value.field_1.o_value)->type;
  if (OVar1 == OBJ_STRING) {
    printf(" : STRING\n");
  }
  else if (OVar1 == OBJ_LAMBDA) {
    printf(" : LAMBDA\n");
  }
  else if (OVar1 == OBJ_DICT) {
    printf(" : DICT\n");
  }
  else {
    printf(" : OBJECT\n");
  }
  return;
}

Assistant:

void print_object_type(CrispyValue value) {
    Object *object = value.o_value;

    switch (object->type) {
        case OBJ_STRING:
            printf(" : STRING\n");
            break;
        case OBJ_LAMBDA:
            printf(" : LAMBDA\n");
            break;
        case OBJ_DICT:
            printf(" : DICT\n");
            break;
        default:
            printf(" : OBJECT\n");
            break;
    }
}